

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O3

reference __thiscall
jsoncons::jsonpath::detail::
union_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
::evaluate(union_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference current,
          result_options options,error_code *param_6)

{
  pointer ppjVar1;
  jsonpath_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  **selector;
  pointer ppjVar2;
  json_array_receiver<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  receiver;
  allocator<char> local_4d;
  result_options local_4c;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_48;
  undefined **local_40;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_38;
  
  local_40 = (undefined **)((ulong)local_40 & 0xffffffffffffff00);
  local_4c = options;
  local_48 = eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
             ::
             create_json<jsoncons::json_array_arg_t_const&,jsoncons::semantic_tag,std::allocator<char>>
                       ((eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
                         *)context,(json_array_arg_t *)&json_array_arg,(semantic_tag *)&local_40,
                        &local_4d);
  local_40 = &PTR__node_receiver_00b3b268;
  ppjVar1 = (this->selectors_).
            super__Vector_base<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>_*,_std::allocator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = local_48;
  for (ppjVar2 = (this->selectors_).
                 super__Vector_base<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>_*,_std::allocator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppjVar2 != ppjVar1;
      ppjVar2 = ppjVar2 + 1) {
    (*(*ppjVar2)->_vptr_jsonpath_selector[2])(*ppjVar2,context,root,last,current,&local_40,local_4c)
    ;
  }
  return local_48;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference current, 
                           result_options options,
                           std::error_code&) const override
        {
            auto jptr = context.create_json(json_array_arg, semantic_tag::none, context.get_allocator());
            json_array_receiver<Json,JsonReference> receiver(jptr);
            select(context,root,last,current,receiver,options);
            return *jptr;
        }